

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

string * __thiscall XmlRpc::XmlRpcValue::doubleToXml_abi_cxx11_(XmlRpcValue *this)

{
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  string *xml;
  allocator<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  allocator<char> local_1ae;
  undefined1 local_1ad;
  locale local_1a0 [8];
  long local_198 [2];
  undefined1 local_188 [392];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  std::ios_base::precision((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),0x11);
  std::ostream::operator<<(local_188,*(double *)(in_RSI + 8));
  local_1ad = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator(&local_1ae);
  std::__cxx11::string::operator+=((string *)in_RDI,"<double>");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffe30);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  std::__cxx11::string::operator+=((string *)in_RDI,"</double>");
  std::__cxx11::string::operator+=((string *)in_RDI,"</value>");
  local_1ad = 1;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return in_RDI;
}

Assistant:

std::string XmlRpcValue::doubleToXml() const
  {
    // ticket #2438
    std::stringstream ss;
    ss.imbue(std::locale::classic()); // ensure we're using "C" locale for formatting floating-point (1.4 vs. 1,4, etc.)
    ss.precision(17);
    ss << _value.asDouble;

    std::string xml = VALUE_TAG;
    xml += DOUBLE_TAG;
    xml += ss.str();
    xml += DOUBLE_ETAG;
    xml += VALUE_ETAG;
    return xml;
  }